

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall notch::core::Net::clear(Net *this)

{
  shared_ptr<notch::core::ALossLayer> local_20;
  Net *local_10;
  Net *this_local;
  
  local_10 = this;
  std::
  vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
  ::clear(&this->layers);
  std::shared_ptr<notch::core::ALossLayer>::shared_ptr(&local_20,(nullptr_t)0x0);
  std::shared_ptr<notch::core::ALossLayer>::operator=(&this->lossLayer,&local_20);
  std::shared_ptr<notch::core::ALossLayer>::~shared_ptr(&local_20);
  return;
}

Assistant:

virtual void clear() {
        layers.clear();
        lossLayer = nullptr;
    }